

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator_type.cpp
# Opt level: O2

string * __thiscall
duckdb::LogicalOperatorToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,LogicalOperatorType type)

{
  int iVar1;
  char *pcVar2;
  allocator local_9;
  
  iVar1 = (int)this;
  switch(iVar1) {
  case 1:
    pcVar2 = "PROJECTION";
    break;
  case 2:
    pcVar2 = "FILTER";
    break;
  case 3:
    pcVar2 = "AGGREGATE";
    break;
  case 4:
    pcVar2 = "WINDOW";
    break;
  case 5:
    pcVar2 = "UNNEST";
    break;
  case 6:
    pcVar2 = "LIMIT";
    break;
  case 7:
    pcVar2 = "ORDER_BY";
    break;
  case 8:
    pcVar2 = "TOP_N";
    break;
  case 9:
  case 0xd:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
    goto switchD_0023b743_caseD_9;
  case 10:
    pcVar2 = "COPY_TO_FILE";
    break;
  case 0xb:
    pcVar2 = "DISTINCT";
    break;
  case 0xc:
    pcVar2 = "SAMPLE";
    break;
  case 0xe:
    pcVar2 = "PIVOT";
    break;
  case 0xf:
    pcVar2 = "COPY_DATABASE";
    break;
  case 0x19:
    pcVar2 = "GET";
    break;
  case 0x1a:
    pcVar2 = "CHUNK_GET";
    break;
  case 0x1b:
    pcVar2 = "DELIM_GET";
    break;
  case 0x1c:
    pcVar2 = "EXPRESSION_GET";
    break;
  case 0x1d:
    pcVar2 = "DUMMY_SCAN";
    break;
  case 0x1e:
    pcVar2 = "EMPTY_RESULT";
    break;
  case 0x1f:
    pcVar2 = "CTE_SCAN";
    break;
  case 0x32:
    pcVar2 = "JOIN";
    break;
  case 0x33:
    pcVar2 = "DELIM_JOIN";
    break;
  case 0x34:
    pcVar2 = "COMPARISON_JOIN";
    break;
  case 0x35:
    pcVar2 = "ANY_JOIN";
    break;
  case 0x36:
    pcVar2 = "CROSS_PRODUCT";
    break;
  case 0x37:
    pcVar2 = "POSITIONAL_JOIN";
    break;
  case 0x38:
    pcVar2 = "ASOF_JOIN";
    break;
  case 0x39:
    pcVar2 = "DEPENDENT_JOIN";
    break;
  case 0x4b:
    pcVar2 = "UNION";
    break;
  case 0x4c:
    pcVar2 = "EXCEPT";
    break;
  case 0x4d:
    pcVar2 = "INTERSECT";
    break;
  case 0x4e:
    pcVar2 = "REC_CTE";
    break;
  case 0x4f:
    pcVar2 = "CTE";
    break;
  default:
    switch(iVar1) {
    case 100:
      pcVar2 = "INSERT";
      break;
    case 0x65:
      pcVar2 = "DELETE";
      break;
    case 0x66:
      pcVar2 = "UPDATE";
      break;
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x76:
    case 0x77:
    case 0x78:
    case 0x79:
    case 0x7a:
    case 0x7b:
    case 0x7c:
      goto switchD_0023b743_caseD_9;
    case 0x7d:
      pcVar2 = "ALTER";
      break;
    case 0x7e:
      pcVar2 = "CREATE_TABLE";
      break;
    case 0x7f:
      pcVar2 = "CREATE_INDEX";
      break;
    case 0x80:
      pcVar2 = "CREATE_SEQUENCE";
      break;
    case 0x81:
      pcVar2 = "CREATE_VIEW";
      break;
    case 0x82:
      pcVar2 = "CREATE_SCHEMA";
      break;
    case 0x83:
      pcVar2 = "CREATE_MACRO";
      break;
    case 0x84:
      pcVar2 = "DROP";
      break;
    case 0x85:
      pcVar2 = "PRAGMA";
      break;
    case 0x86:
      pcVar2 = "TRANSACTION";
      break;
    case 0x87:
      pcVar2 = "CREATE_TYPE";
      break;
    case 0x88:
      pcVar2 = "ATTACH";
      break;
    case 0x89:
      pcVar2 = "DETACH";
      break;
    default:
      switch(iVar1) {
      case 0xaf:
        pcVar2 = "PREPARE";
        break;
      case 0xb0:
        pcVar2 = "EXECUTE";
        break;
      case 0xb1:
        pcVar2 = "EXPORT";
        break;
      case 0xb2:
        pcVar2 = "VACUUM";
        break;
      case 0xb3:
        pcVar2 = "SET";
        break;
      case 0xb4:
        pcVar2 = "LOAD";
        break;
      case 0xb5:
        pcVar2 = "RESET";
        break;
      case 0xb6:
        pcVar2 = "UPDATE_EXTENSIONS";
        break;
      case 0xbe:
        pcVar2 = "CREATE_SECRET";
        break;
      default:
        if (iVar1 == 0x96) {
          pcVar2 = "EXPLAIN";
          break;
        }
        if (iVar1 == 0xff) {
          pcVar2 = "CUSTOM_OP";
          break;
        }
      case 0xb7:
      case 0xb8:
      case 0xb9:
      case 0xba:
      case 0xbb:
      case 0xbc:
      case 0xbd:
switchD_0023b743_caseD_9:
        pcVar2 = "INVALID";
      }
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_9);
  return __return_storage_ptr__;
}

Assistant:

string LogicalOperatorToString(LogicalOperatorType type) {
	switch (type) {
	case LogicalOperatorType::LOGICAL_GET:
		return "GET";
	case LogicalOperatorType::LOGICAL_CHUNK_GET:
		return "CHUNK_GET";
	case LogicalOperatorType::LOGICAL_DELIM_GET:
		return "DELIM_GET";
	case LogicalOperatorType::LOGICAL_EMPTY_RESULT:
		return "EMPTY_RESULT";
	case LogicalOperatorType::LOGICAL_EXPRESSION_GET:
		return "EXPRESSION_GET";
	case LogicalOperatorType::LOGICAL_ANY_JOIN:
		return "ANY_JOIN";
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
		return "ASOF_JOIN";
	case LogicalOperatorType::LOGICAL_DEPENDENT_JOIN:
		return "DEPENDENT_JOIN";
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
		return "COMPARISON_JOIN";
	case LogicalOperatorType::LOGICAL_DELIM_JOIN:
		return "DELIM_JOIN";
	case LogicalOperatorType::LOGICAL_PROJECTION:
		return "PROJECTION";
	case LogicalOperatorType::LOGICAL_FILTER:
		return "FILTER";
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY:
		return "AGGREGATE";
	case LogicalOperatorType::LOGICAL_WINDOW:
		return "WINDOW";
	case LogicalOperatorType::LOGICAL_UNNEST:
		return "UNNEST";
	case LogicalOperatorType::LOGICAL_LIMIT:
		return "LIMIT";
	case LogicalOperatorType::LOGICAL_ORDER_BY:
		return "ORDER_BY";
	case LogicalOperatorType::LOGICAL_TOP_N:
		return "TOP_N";
	case LogicalOperatorType::LOGICAL_SAMPLE:
		return "SAMPLE";
	case LogicalOperatorType::LOGICAL_COPY_TO_FILE:
		return "COPY_TO_FILE";
	case LogicalOperatorType::LOGICAL_COPY_DATABASE:
		return "COPY_DATABASE";
	case LogicalOperatorType::LOGICAL_JOIN:
		return "JOIN";
	case LogicalOperatorType::LOGICAL_CROSS_PRODUCT:
		return "CROSS_PRODUCT";
	case LogicalOperatorType::LOGICAL_POSITIONAL_JOIN:
		return "POSITIONAL_JOIN";
	case LogicalOperatorType::LOGICAL_UNION:
		return "UNION";
	case LogicalOperatorType::LOGICAL_EXCEPT:
		return "EXCEPT";
	case LogicalOperatorType::LOGICAL_INTERSECT:
		return "INTERSECT";
	case LogicalOperatorType::LOGICAL_INSERT:
		return "INSERT";
	case LogicalOperatorType::LOGICAL_DISTINCT:
		return "DISTINCT";
	case LogicalOperatorType::LOGICAL_DELETE:
		return "DELETE";
	case LogicalOperatorType::LOGICAL_UPDATE:
		return "UPDATE";
	case LogicalOperatorType::LOGICAL_PREPARE:
		return "PREPARE";
	case LogicalOperatorType::LOGICAL_DUMMY_SCAN:
		return "DUMMY_SCAN";
	case LogicalOperatorType::LOGICAL_CREATE_INDEX:
		return "CREATE_INDEX";
	case LogicalOperatorType::LOGICAL_CREATE_TABLE:
		return "CREATE_TABLE";
	case LogicalOperatorType::LOGICAL_CREATE_MACRO:
		return "CREATE_MACRO";
	case LogicalOperatorType::LOGICAL_EXPLAIN:
		return "EXPLAIN";
	case LogicalOperatorType::LOGICAL_EXECUTE:
		return "EXECUTE";
	case LogicalOperatorType::LOGICAL_VACUUM:
		return "VACUUM";
	case LogicalOperatorType::LOGICAL_RECURSIVE_CTE:
		return "REC_CTE";
	case LogicalOperatorType::LOGICAL_MATERIALIZED_CTE:
		return "CTE";
	case LogicalOperatorType::LOGICAL_CTE_REF:
		return "CTE_SCAN";
	case LogicalOperatorType::LOGICAL_ALTER:
		return "ALTER";
	case LogicalOperatorType::LOGICAL_CREATE_SEQUENCE:
		return "CREATE_SEQUENCE";
	case LogicalOperatorType::LOGICAL_CREATE_TYPE:
		return "CREATE_TYPE";
	case LogicalOperatorType::LOGICAL_CREATE_VIEW:
		return "CREATE_VIEW";
	case LogicalOperatorType::LOGICAL_CREATE_SCHEMA:
		return "CREATE_SCHEMA";
	case LogicalOperatorType::LOGICAL_CREATE_SECRET:
		return "CREATE_SECRET";
	case LogicalOperatorType::LOGICAL_ATTACH:
		return "ATTACH";
	case LogicalOperatorType::LOGICAL_DETACH:
		return "DETACH";
	case LogicalOperatorType::LOGICAL_DROP:
		return "DROP";
	case LogicalOperatorType::LOGICAL_PRAGMA:
		return "PRAGMA";
	case LogicalOperatorType::LOGICAL_TRANSACTION:
		return "TRANSACTION";
	case LogicalOperatorType::LOGICAL_EXPORT:
		return "EXPORT";
	case LogicalOperatorType::LOGICAL_SET:
		return "SET";
	case LogicalOperatorType::LOGICAL_RESET:
		return "RESET";
	case LogicalOperatorType::LOGICAL_LOAD:
		return "LOAD";
	case LogicalOperatorType::LOGICAL_INVALID:
		break;
	case LogicalOperatorType::LOGICAL_EXTENSION_OPERATOR:
		return "CUSTOM_OP";
	case LogicalOperatorType::LOGICAL_PIVOT:
		return "PIVOT";
	case LogicalOperatorType::LOGICAL_UPDATE_EXTENSIONS:
		return "UPDATE_EXTENSIONS";
	}
	return "INVALID";
}